

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rterror.cpp
# Opt level: O3

char16 * LoadResourceStr(UINT id)

{
  void *pvVar1;
  char16 *pcVar2;
  UINT local_20 [2];
  _ResourceStr key;
  
  if (s_resourceStrsSorted == '\0') {
    qsort(s_resourceStrs,0x2a8,0x10,compare_ResourceStr);
    s_resourceStrsSorted = '\x01';
  }
  key.id = 0;
  key._4_4_ = 0;
  local_20[0] = id;
  pvVar1 = PAL_bsearch(local_20,s_resourceStrs,0x2a8,0x10,compare_ResourceStr);
  if (pvVar1 == (void *)0x0) {
    pcVar2 = (char16 *)0x0;
  }
  else {
    pcVar2 = *(char16 **)((long)pvVar1 + 8);
  }
  return pcVar2;
}

Assistant:

const char16* LoadResourceStr(UINT id)
{
    if (!s_resourceStrsSorted)
    {
        qsort(s_resourceStrs,
            _countof(s_resourceStrs), sizeof(s_resourceStrs[0]),
            compare_ResourceStr);
        s_resourceStrsSorted = true;
    }

    _ResourceStr key = { id, nullptr };
    const void* p = bsearch(&key,
        s_resourceStrs, _countof(s_resourceStrs), sizeof(s_resourceStrs[0]),
        compare_ResourceStr);

    return p ? reinterpret_cast<const _ResourceStr*>(p)->str : nullptr;
}